

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O2

uint CRC::ComputeCrc32(uint polynomial,uchar *buffer,uint size)

{
  int i;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  uint auStack_408 [258];
  
  for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
    iVar5 = 8;
    uVar4 = uVar2 & 0xffffffff;
    while( true ) {
      bVar6 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      uVar1 = (uint)uVar4;
      if (bVar6) break;
      uVar4 = (ulong)(uVar1 >> 1 ^ -(uVar1 & 1) & polynomial);
    }
    auStack_408[uVar2] = uVar1;
  }
  uVar1 = 0xffffffff;
  for (lVar3 = 0; size != (uint)lVar3; lVar3 = lVar3 + 1) {
    uVar1 = uVar1 >> 8 ^ auStack_408[(byte)(buffer[lVar3] ^ (byte)uVar1)];
  }
  return ~uVar1;
}

Assistant:

unsigned int CRC::ComputeCrc32(unsigned int polynomial, const unsigned char* buffer, unsigned int size)
{
   // Compute the array
   int crc_array [ 256 ];

   for (int i = 0; i < 256; i++)
   {
      unsigned int crc = i;
      for (int b = 0; b < 8; b++)
      {
         if ((crc & 1) == 1)
         {
            crc = (polynomial ^ (crc >> 1));
         }
         else
         {
            crc >>= 1;
         }
      }
      crc_array[i] = crc;
   }

   unsigned int crc = ~0;

   while (size--)
   {
      crc = crc_array[(crc ^ *buffer++) & 0xff] ^ (crc >> 8);
   }
   return crc ^ ~0;
}